

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

void google::protobuf::compiler::cpp::ListAllTypesForServices
               (FileDescriptor *fd,
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *types)

{
  ServiceDescriptor *pSVar1;
  long lVar2;
  MethodDescriptor *this;
  long lVar3;
  long lVar4;
  Descriptor *local_48;
  FileDescriptor *local_40;
  long local_38;
  
  if (0 < fd->service_count_) {
    lVar2 = 0;
    local_40 = fd;
    do {
      pSVar1 = local_40->services_;
      local_38 = lVar2;
      if (0 < pSVar1[lVar2].method_count_) {
        lVar4 = 0;
        lVar3 = 0;
        do {
          this = (MethodDescriptor *)(&(pSVar1[lVar2].methods_)->super_SymbolBase + lVar4);
          local_48 = MethodDescriptor::input_type(this);
          std::
          vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
          ::emplace_back<google::protobuf::Descriptor_const*>
                    ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                      *)types,&local_48);
          local_48 = MethodDescriptor::output_type(this);
          std::
          vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
          ::emplace_back<google::protobuf::Descriptor_const*>
                    ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                      *)types,&local_48);
          lVar3 = lVar3 + 1;
          lVar4 = lVar4 + 0x50;
        } while (lVar3 < pSVar1[lVar2].method_count_);
      }
      lVar2 = local_38 + 1;
    } while (lVar2 < local_40->service_count_);
  }
  return;
}

Assistant:

void ListAllTypesForServices(const FileDescriptor* fd,
                             std::vector<const Descriptor*>* types) {
  for (int i = 0; i < fd->service_count(); i++) {
    const ServiceDescriptor* sd = fd->service(i);
    for (int j = 0; j < sd->method_count(); j++) {
      const MethodDescriptor* method = sd->method(j);
      types->push_back(method->input_type());
      types->push_back(method->output_type());
    }
  }
}